

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnLoadSplatExpr
          (BinaryReaderIR *this,Opcode opcode,Address alignment_log2,Address offset)

{
  Result RVar1;
  Expr *local_30;
  int local_28;
  Opcode opcode_local;
  _Head_base<0UL,_wabt::Expr_*,_false> local_20;
  Address offset_local;
  
  local_28 = 1 << ((byte)alignment_log2 & 0x1f);
  opcode_local = opcode;
  offset_local = offset;
  MakeUnique<wabt::LoadStoreExpr<(wabt::ExprType)44>,wabt::Opcode&,int,unsigned_long&>
            ((wabt *)&local_30,&opcode_local,&local_28,&offset_local);
  local_20._M_head_impl = local_30;
  local_30 = (Expr *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_20);
  if (local_20._M_head_impl != (Expr *)0x0) {
    (*(local_20._M_head_impl)->_vptr_Expr[1])();
  }
  if (local_30 != (Expr *)0x0) {
    (**(code **)(*(long *)local_30 + 8))();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnLoadSplatExpr(Opcode opcode,
                                       Address alignment_log2,
                                       Address offset) {
  return AppendExpr(
      MakeUnique<LoadSplatExpr>(opcode, 1 << alignment_log2, offset));
}